

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_resources(CompilerGLSL *this)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  uint32_t uVar4;
  Types TVar5;
  uint32_t uVar6;
  SPIRConstantOp *constant;
  SmallVector<unsigned_int,_8UL> *this_00;
  uint *puVar7;
  SPIRVariable *var_00;
  SPIRType *type_00;
  SPIRConstant *pSVar8;
  byte local_3c9;
  byte local_39b;
  byte local_399;
  byte local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [32];
  spirv_cross local_300 [32];
  string local_2e0 [8];
  string initializer;
  SPIRVariable *var;
  uint global;
  uint *__end1_1;
  uint *__begin1_1;
  SmallVector<unsigned_int,_8UL> *__range1_1;
  bool *local_290;
  bool *local_288;
  bool local_279;
  undefined1 auStack_278 [7];
  bool emitted_base_instance;
  bool *local_270;
  bool *local_268;
  bool local_259;
  anon_class_8_1_8991fb9c aStack_258;
  bool skip_separate_image_sampler;
  anon_class_8_1_8991fb9c local_250;
  anon_class_8_1_8991fb9c local_248;
  anon_class_8_1_8991fb9c local_240;
  uint32_t local_234;
  uint *puStack_230;
  uint type_1;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  undefined1 local_1f8 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  TypedID<(spirv_cross::Types)3> local_d8;
  TypedID<(spirv_cross::Types)3> local_d4;
  SpecializationConstant local_d0;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  byte local_a9;
  SPIRType *pSStack_a8;
  bool is_natural_struct;
  SPIRType *type;
  undefined1 local_98 [47];
  bool needs_declaration;
  SPIRConstant *c;
  Variant *local_58;
  Variant *id;
  TypedID<(spirv_cross::Types)0> *id_;
  TypedID<(spirv_cross::Types)0> *__end1;
  TypedID<(spirv_cross::Types)0> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1;
  LoopLock loop_lock;
  pointer puStack_20;
  bool emitted;
  char *storage;
  SPIREntryPoint *execution;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)this;
  storage = (char *)Compiler::get_entry_point(&this->super_Compiler);
  (*(this->super_Compiler)._vptr_Compiler[0x39])();
  if ((*(int *)(storage + 0xe8) == 4) && (bVar3 = is_legacy(this), bVar3)) {
    replace_fragment_outputs(this);
  }
  bVar3 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                    (&this->pls_inputs);
  if ((!bVar3) ||
     (bVar3 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                        (&this->pls_outputs), !bVar3)) {
    emit_pls(this);
  }
  if ((*(int *)(storage + 0xe8) - 1U < 3) || (*(int *)(storage + 0xe8) == 0x14f5)) {
    fixup_implicit_builtin_block_names(this,*(ExecutionModel *)(storage + 0xe8));
  }
  if (((((this->options).separate_shader_objects & 1U) == 0) || (((this->options).es & 1U) != 0)) ||
     (*(int *)(storage + 0xe8) == 4)) {
    bVar3 = should_force_emit_builtin_block(this,StorageClassOutput);
    if (bVar3) {
      emit_declared_builtin_block(this,StorageClassOutput,*(ExecutionModel *)(storage + 0xe8));
    }
    else if ((storage[0xec] & 1U) == 0) {
      pcVar2 = "--pls-out";
      if (*(int *)(storage + 0xe8) == 4) {
        pcVar2 = "--pls-in";
      }
      puStack_20 = (pointer)(pcVar2 + 6);
      if ((this->super_Compiler).clip_distance_count != 0) {
        statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                  (this,(char **)&stack0xffffffffffffffe0,(char (*) [24])0x5af96c,
                   &(this->super_Compiler).clip_distance_count,(char (*) [3])0x5b704e);
      }
      if ((this->super_Compiler).cull_distance_count != 0) {
        statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                  (this,(char **)&stack0xffffffffffffffe0,(char (*) [24])0x5af985,
                   &(this->super_Compiler).cull_distance_count,(char (*) [3])0x5b704e);
      }
      if (((this->super_Compiler).clip_distance_count != 0) ||
         ((this->super_Compiler).cull_distance_count != 0)) {
        statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
      }
    }
    else {
      emit_declared_builtin_block(this,StorageClassInput,*(ExecutionModel *)(storage + 0xe8));
    }
    goto LAB_00331585;
  }
  iVar1 = *(int *)(storage + 0xe8);
  if (iVar1 != 0) {
    if (iVar1 - 1U < 3) {
      emit_declared_builtin_block(this,StorageClassInput,*(ExecutionModel *)(storage + 0xe8));
      emit_declared_builtin_block(this,StorageClassOutput,*(ExecutionModel *)(storage + 0xe8));
      goto LAB_00331585;
    }
    if (iVar1 != 0x14f5) goto LAB_00331585;
  }
  emit_declared_builtin_block(this,StorageClassOutput,*(ExecutionModel *)(storage + 0xe8));
LAB_00331585:
  if (((this->super_Compiler).position_invariant & 1U) != 0) {
    statement<char_const(&)[23]>(this,(char (*) [23])"invariant gl_Position;");
    statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
  }
  loop_lock.lock._7_1_ = 0;
  ParsedIR::create_loop_hard_lock((ParsedIR *)&__range1);
  __begin1 = (TypedID<(spirv_cross::Types)0> *)&(this->super_Compiler).ir.ids_for_constant_or_type;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  id_ = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                  ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  for (; __end1 != id_; __end1 = __end1 + 1) {
    id = (Variant *)__end1;
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    local_58 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                          (ulong)uVar4);
    TVar5 = Variant::get_type(local_58);
    if (TVar5 == TypeConstant) {
      register0x00000000 = Variant::get<spirv_cross::SPIRConstant>(local_58);
      local_371 = 1;
      if ((register0x00000000->specialization & 1U) == 0) {
        local_371 = register0x00000000->is_used_as_lut;
      }
      local_98[0x27] = local_371 & 1;
      if (local_98[0x27] != 0) {
        if ((((this->options).vulkan_semantics & 1U) == 0) &&
           ((register0x00000000->specialization & 1U) != 0)) {
          Compiler::get_decoration
                    (&this->super_Compiler,(ID)(register0x00000000->super_IVariant).self.id,
                     DecorationSpecId);
          constant_value_macro_name_abi_cxx11_((CompilerGLSL *)local_98,(uint32_t)this);
          ::std::__cxx11::string::operator=
                    ((string *)&stack0xffffffffffffff90->specialization_constant_macro_name,
                     (string *)local_98);
          ::std::__cxx11::string::~string((string *)local_98);
        }
        emit_constant(this,stack0xffffffffffffff90);
        loop_lock.lock._7_1_ = 1;
      }
    }
    else {
      TVar5 = Variant::get_type(local_58);
      if (TVar5 == TypeConstantOp) {
        constant = Variant::get<spirv_cross::SPIRConstantOp>(local_58);
        emit_specialization_constant_op(this,constant);
        loop_lock.lock._7_1_ = 1;
      }
      else {
        TVar5 = Variant::get_type(local_58);
        if (TVar5 == TypeType) {
          pSStack_a8 = Variant::get<spirv_cross::SPIRType>(local_58);
          local_399 = 0;
          if (*(int *)&(pSStack_a8->super_IVariant).field_0xc == 0xf) {
            bVar3 = VectorView<unsigned_int>::empty
                              (&(pSStack_a8->array).super_VectorView<unsigned_int>);
            local_399 = 0;
            if ((bVar3) && (local_399 = 0, (pSStack_a8->pointer & 1U) == 0)) {
              bVar3 = Compiler::has_decoration
                                (&this->super_Compiler,(ID)(pSStack_a8->super_IVariant).self.id,
                                 DecorationBlock);
              local_39b = 0;
              if (!bVar3) {
                bVar3 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(pSStack_a8->super_IVariant).self.id,
                                   DecorationBufferBlock);
                local_39b = bVar3 ^ 0xff;
              }
              local_399 = local_39b;
            }
          }
          local_a9 = local_399 & 1;
          if ((((*(int *)&(pSStack_a8->super_IVariant).field_0xc == 0xf) &&
               ((pSStack_a8->pointer & 1U) != 0)) &&
              (bVar3 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSStack_a8->super_IVariant).self.id,
                                  DecorationBlock), bVar3)) &&
             (((pSStack_a8->storage == StorageClassRayPayloadKHR ||
               (pSStack_a8->storage == StorageClassIncomingRayPayloadKHR)) ||
              (pSStack_a8->storage == StorageClassHitAttributeKHR)))) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_a8->parent_type);
            pSStack_a8 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
            local_a9 = 1;
          }
          if (local_a9 != 0) {
            if ((loop_lock.lock._7_1_ & 1) != 0) {
              statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
            }
            loop_lock.lock._7_1_ = 0;
            emit_struct(this,pSStack_a8);
          }
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&__range1);
  if ((loop_lock.lock._7_1_ & 1) != 0) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
  }
  if (((*(int *)(storage + 0xe8) == 5) && (((this->options).vulkan_semantics & 1U) == 0)) &&
     ((*(int *)(storage + 0xd8) != 0 ||
      (bVar3 = Bitset::get((Bitset *)(storage + 0x80),0x26), bVar3)))) {
    SpecializationConstant::SpecializationConstant(&wg_y);
    SpecializationConstant::SpecializationConstant(&wg_z);
    SpecializationConstant::SpecializationConstant(&local_d0);
    Compiler::get_work_group_size_specialization_constants
              (&this->super_Compiler,&wg_y,&wg_z,&local_d0);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_y);
    TypedID<(spirv_cross::Types)3>::TypedID(&local_d4,0);
    uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_d4);
    bVar3 = true;
    if (uVar4 == uVar6) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_z);
      TypedID<(spirv_cross::Types)3>::TypedID(&local_d8,0);
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_d8);
      bVar3 = true;
      if (uVar4 == uVar6) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_d0);
        TypedID<(spirv_cross::Types)3>::TypedID
                  ((TypedID<(spirv_cross::Types)3> *)(inputs.stack_storage.aligned_char + 0xfc),0);
        uVar6 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)(inputs.stack_storage.aligned_char + 0xfc));
        bVar3 = uVar4 != uVar6;
      }
    }
    if (bVar3) {
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1f8);
      build_workgroup_size
                (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_1f8,&wg_y,&wg_z,&local_d0);
      merge((spirv_cross *)&__range2,
            (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)local_1f8,", ");
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
                (this,(char (*) [8])"layout(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 (char (*) [6])0x5ade12);
      ::std::__cxx11::string::~string((string *)&__range2);
      statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1f8);
    }
  }
  loop_lock.lock._7_1_ = 0;
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    __begin2 = (uint *)&(this->super_Compiler).physical_storage_non_block_pointer_types;
    __end2 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin2);
    puStack_230 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin2);
    for (; __end2 != puStack_230; __end2 = __end2 + 1) {
      local_234 = *__end2;
      emit_buffer_reference_block(this,local_234,false);
    }
    local_240.this = this;
    ParsedIR::
    for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerGLSL::emit_resources()::__0>
              (&(this->super_Compiler).ir,&local_240);
    local_248.this = this;
    ParsedIR::
    for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerGLSL::emit_resources()::__1>
              (&(this->super_Compiler).ir,&local_248);
  }
  local_250.this = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_resources()::__2>
            (&(this->super_Compiler).ir,&local_250);
  aStack_258.this = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_resources()::__3>
            (&(this->super_Compiler).ir,&stack0xfffffffffffffda8);
  bVar3 = VectorView<spirv_cross::CombinedImageSampler>::empty
                    (&(this->super_Compiler).combined_image_samplers.
                      super_VectorView<spirv_cross::CombinedImageSampler>);
  local_3c9 = 1;
  if (bVar3) {
    local_3c9 = (this->options).vulkan_semantics ^ 0xff;
  }
  local_259 = (bool)(local_3c9 & 1);
  local_270 = &local_259;
  local_268 = (bool *)((long)&loop_lock.lock + 7);
  _auStack_278 = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_resources()::__4>
            (&(this->super_Compiler).ir,(anon_class_24_3_cd3e9deb *)auStack_278);
  if ((loop_lock.lock._7_1_ & 1) != 0) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
  }
  loop_lock.lock._7_1_ = 0;
  local_279 = false;
  local_290 = (bool *)((long)&loop_lock.lock + 7);
  local_288 = &local_279;
  __range1_1 = (SmallVector<unsigned_int,_8UL> *)this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_resources()::__5>
            (&(this->super_Compiler).ir,(anon_class_24_3_84543f17 *)&__range1_1);
  this_00 = &(this->super_Compiler).global_variables;
  __end1_1 = VectorView<unsigned_int>::begin(&this_00->super_VectorView<unsigned_int>);
  puVar7 = VectorView<unsigned_int>::end(&this_00->super_VectorView<unsigned_int>);
  for (; __end1_1 != puVar7; __end1_1 = __end1_1 + 1) {
    var_00 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,*__end1_1);
    bVar3 = Compiler::is_hidden_variable(&this->super_Compiler,var_00,true);
    if (!bVar3) {
      if (var_00->storage == StorageClassOutput) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_00->initializer);
        if (uVar4 != 0) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_00->initializer);
          pSVar8 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar4);
          if (pSVar8 != (SPIRConstant *)0x0) {
            emit_output_variable_initializer(this,var_00);
          }
        }
      }
      else {
        bVar3 = variable_is_lut(this,var_00);
        if (!bVar3) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_00->super_IVariant).self);
          add_resource_name(this,uVar4);
          ::std::__cxx11::string::string(local_2e0);
          if ((((((this->options).force_zero_initialized_variables & 1U) != 0) &&
               (var_00->storage == StorageClassPrivate)) &&
              (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_00->initializer),
              uVar4 == 0)) &&
             (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_00->static_expression),
             uVar4 == 0)) {
            type_00 = Compiler::get_variable_data_type(&this->super_Compiler,var_00);
            bVar3 = type_can_zero_initialize(this,type_00);
            if (bVar3) {
              uVar4 = Compiler::get_variable_data_type_id(&this->super_Compiler,var_00);
              (*(this->super_Compiler)._vptr_Compiler[0x37])(local_320,this,(ulong)uVar4);
              join<char_const(&)[4],std::__cxx11::string>
                        (local_300,(char (*) [4])0x5cb349,local_320);
              ::std::__cxx11::string::operator=(local_2e0,(string *)local_300);
              ::std::__cxx11::string::~string((string *)local_300);
              ::std::__cxx11::string::~string((string *)local_320);
            }
          }
          (*(this->super_Compiler)._vptr_Compiler[0x26])(local_340,this,var_00);
          statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (this,local_340,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                     (char (*) [2])0x5b3b6f);
          ::std::__cxx11::string::~string((string *)local_340);
          loop_lock.lock._7_1_ = 1;
          ::std::__cxx11::string::~string(local_2e0);
        }
      }
    }
  }
  if ((loop_lock.lock._7_1_ & 1) != 0) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x3b])();
  return;
}

Assistant:

void CompilerGLSL::emit_resources()
{
	auto &execution = get_entry_point();

	replace_illegal_names();

	// Legacy GL uses gl_FragData[], redeclare all fragment outputs
	// with builtins.
	if (execution.model == ExecutionModelFragment && is_legacy())
		replace_fragment_outputs();

	// Emit PLS blocks if we have such variables.
	if (!pls_inputs.empty() || !pls_outputs.empty())
		emit_pls();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelMeshEXT:
		fixup_implicit_builtin_block_names(execution.model);
		break;

	default:
		break;
	}

	// Emit custom gl_PerVertex for SSO compatibility.
	if (options.separate_shader_objects && !options.es && execution.model != ExecutionModelFragment)
	{
		switch (execution.model)
		{
		case ExecutionModelGeometry:
		case ExecutionModelTessellationControl:
		case ExecutionModelTessellationEvaluation:
			emit_declared_builtin_block(StorageClassInput, execution.model);
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			break;

		case ExecutionModelVertex:
		case ExecutionModelMeshEXT:
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			break;

		default:
			break;
		}
	}
	else if (should_force_emit_builtin_block(StorageClassOutput))
	{
		emit_declared_builtin_block(StorageClassOutput, execution.model);
	}
	else if (execution.geometry_passthrough)
	{
		// Need to declare gl_in with Passthrough.
		// If we're doing passthrough, we cannot emit an output block, so the output block test above will never pass.
		emit_declared_builtin_block(StorageClassInput, execution.model);
	}
	else
	{
		// Need to redeclare clip/cull distance with explicit size to use them.
		// SPIR-V mandates these builtins have a size declared.
		const char *storage = execution.model == ExecutionModelFragment ? "in" : "out";
		if (clip_distance_count != 0)
			statement(storage, " float gl_ClipDistance[", clip_distance_count, "];");
		if (cull_distance_count != 0)
			statement(storage, " float gl_CullDistance[", cull_distance_count, "];");
		if (clip_distance_count != 0 || cull_distance_count != 0)
			statement("");
	}

	if (position_invariant)
	{
		statement("invariant gl_Position;");
		statement("");
	}

	bool emitted = false;

	// If emitted Vulkan GLSL,
	// emit specialization constants as actual floats,
	// spec op expressions will redirect to the constant name.
	//
	{
		auto loop_lock = ir.create_loop_hard_lock();
		for (auto &id_ : ir.ids_for_constant_or_type)
		{
			auto &id = ir.ids[id_];

			if (id.get_type() == TypeConstant)
			{
				auto &c = id.get<SPIRConstant>();

				bool needs_declaration = c.specialization || c.is_used_as_lut;

				if (needs_declaration)
				{
					if (!options.vulkan_semantics && c.specialization)
					{
						c.specialization_constant_macro_name =
						    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
					}
					emit_constant(c);
					emitted = true;
				}
			}
			else if (id.get_type() == TypeConstantOp)
			{
				emit_specialization_constant_op(id.get<SPIRConstantOp>());
				emitted = true;
			}
			else if (id.get_type() == TypeType)
			{
				auto *type = &id.get<SPIRType>();

				bool is_natural_struct = type->basetype == SPIRType::Struct && type->array.empty() && !type->pointer &&
				                         (!has_decoration(type->self, DecorationBlock) &&
				                          !has_decoration(type->self, DecorationBufferBlock));

				// Special case, ray payload and hit attribute blocks are not really blocks, just regular structs.
				if (type->basetype == SPIRType::Struct && type->pointer &&
				    has_decoration(type->self, DecorationBlock) &&
				    (type->storage == StorageClassRayPayloadKHR || type->storage == StorageClassIncomingRayPayloadKHR ||
				     type->storage == StorageClassHitAttributeKHR))
				{
					type = &get<SPIRType>(type->parent_type);
					is_natural_struct = true;
				}

				if (is_natural_struct)
				{
					if (emitted)
						statement("");
					emitted = false;

					emit_struct(*type);
				}
			}
		}
	}

	if (emitted)
		statement("");

	// If we needed to declare work group size late, check here.
	// If the work group size depends on a specialization constant, we need to declare the layout() block
	// after constants (and their macros) have been declared.
	if (execution.model == ExecutionModelGLCompute && !options.vulkan_semantics &&
	    (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId)))
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		if ((wg_x.id != ConstantID(0)) || (wg_y.id != ConstantID(0)) || (wg_z.id != ConstantID(0)))
		{
			SmallVector<string> inputs;
			build_workgroup_size(inputs, wg_x, wg_y, wg_z);
			statement("layout(", merge(inputs), ") in;");
			statement("");
		}
	}

	emitted = false;

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		for (auto type : physical_storage_non_block_pointer_types)
		{
			emit_buffer_reference_block(type, false);
		}

		// Output buffer reference blocks.
		// Do this in two stages, one with forward declaration,
		// and one without. Buffer reference blocks can reference themselves
		// to support things like linked lists.
		ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
			if (type.basetype == SPIRType::Struct && type.pointer &&
			    type.pointer_depth == 1 && !type_is_array_of_pointers(type) &&
			    type.storage == StorageClassPhysicalStorageBufferEXT)
			{
				emit_buffer_reference_block(self, true);
			}
		});

		ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
			if (type.basetype == SPIRType::Struct &&
			    type.pointer && type.pointer_depth == 1 && !type_is_array_of_pointers(type) &&
			    type.storage == StorageClassPhysicalStorageBufferEXT)
			{
				emit_buffer_reference_block(self, false);
			}
		});
	}

	// Output UBOs and SSBOs
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_block_storage = type.storage == StorageClassStorageBuffer || type.storage == StorageClassUniform ||
		                        type.storage == StorageClassShaderRecordBufferKHR;
		bool has_block_flags = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
		                       ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

		if (var.storage != StorageClassFunction && type.pointer && is_block_storage && !is_hidden_variable(var) &&
		    has_block_flags)
		{
			emit_buffer_block(var);
		}
	});

	// Output push constant blocks
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassPushConstant &&
		    !is_hidden_variable(var))
		{
			emit_push_constant_block(var);
		}
	});

	bool skip_separate_image_sampler = !combined_image_samplers.empty() || !options.vulkan_semantics;

	// Output Uniform Constants (values, samplers, images, etc).
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// If we're remapping separate samplers and images, only emit the combined samplers.
		if (skip_separate_image_sampler)
		{
			// Sampler buffers are always used without a sampler, and they will also work in regular GL.
			bool sampler_buffer = type.basetype == SPIRType::Image && type.image.dim == DimBuffer;
			bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
			bool separate_sampler = type.basetype == SPIRType::Sampler;
			if (!sampler_buffer && (separate_image || separate_sampler))
				return;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter ||
		     type.storage == StorageClassRayPayloadKHR || type.storage == StorageClassIncomingRayPayloadKHR ||
		     type.storage == StorageClassCallableDataKHR || type.storage == StorageClassIncomingCallableDataKHR ||
		     type.storage == StorageClassHitAttributeKHR) &&
		    !is_hidden_variable(var))
		{
			emit_uniform(var);
			emitted = true;
		}
	});

	if (emitted)
		statement("");
	emitted = false;

	bool emitted_base_instance = false;

	// Output in/out interfaces.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_hidden = is_hidden_variable(var);

		// Unused output I/O variables might still be required to implement framebuffer fetch.
		if (var.storage == StorageClassOutput && !is_legacy() &&
		    location_is_framebuffer_fetch(get_decoration(var.self, DecorationLocation)) != 0)
		{
			is_hidden = false;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    interface_variable_exists_in_entry_point(var.self) && !is_hidden)
		{
			if (options.es && get_execution_model() == ExecutionModelVertex && var.storage == StorageClassInput &&
			    type.array.size() == 1)
			{
				SPIRV_CROSS_THROW("OpenGL ES doesn't support array input variables in vertex shader.");
			}
			emit_interface_block(var);
			emitted = true;
		}
		else if (is_builtin_variable(var))
		{
			auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			// For gl_InstanceIndex emulation on GLES, the API user needs to
			// supply this uniform.

			// The draw parameter extension is soft-enabled on GL with some fallbacks.
			if (!options.vulkan_semantics)
			{
				if (!emitted_base_instance &&
				    ((options.vertex.support_nonzero_base_instance && builtin == BuiltInInstanceIndex) ||
				     (builtin == BuiltInBaseInstance)))
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseInstance;");
					statement("#endif");
					emitted = true;
					emitted_base_instance = true;
				}
				else if (builtin == BuiltInBaseVertex)
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseVertex;");
					statement("#endif");
				}
				else if (builtin == BuiltInDrawIndex)
				{
					statement("#ifndef GL_ARB_shader_draw_parameters");
					// Cannot really be worked around.
					statement("#error GL_ARB_shader_draw_parameters is not supported.");
					statement("#endif");
				}
			}
		}
	});

	// Global variables.
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (is_hidden_variable(var, true))
			continue;

		if (var.storage != StorageClassOutput)
		{
			if (!variable_is_lut(var))
			{
				add_resource_name(var.self);

				string initializer;
				if (options.force_zero_initialized_variables && var.storage == StorageClassPrivate &&
				    !var.initializer && !var.static_expression && type_can_zero_initialize(get_variable_data_type(var)))
				{
					initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(var)));
				}

				statement(variable_decl(var), initializer, ";");
				emitted = true;
			}
		}
		else if (var.initializer && maybe_get<SPIRConstant>(var.initializer) != nullptr)
		{
			emit_output_variable_initializer(var);
		}
	}

	if (emitted)
		statement("");

	declare_undefined_values();
}